

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  float fVar3;
  char cVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImU32 IVar9;
  uint uVar10;
  char *pcVar11;
  ImGuiCol idx;
  ImDrawList *this;
  ulong uVar12;
  ImGuiTableColumn *pIVar13;
  ImDrawList *this_00;
  bool bVar14;
  float fVar15;
  float fVar16;
  ImVec2 local_68;
  float local_5c;
  ImVec2 local_58;
  ImVec2 IStack_50;
  float local_44;
  ImDrawList *local_40;
  ImDrawList *local_38;
  
  pIVar5 = table->OuterWindow;
  pIVar6 = table->InnerWindow;
  ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar6->DrawList,0);
  if (pIVar6->Hidden != false) {
    return;
  }
  fVar16 = (table->HostClipRect).Max.y;
  pfVar1 = &(table->InnerClipRect).Min.y;
  if (fVar16 < *pfVar1 || fVar16 == *pfVar1) {
    return;
  }
  fVar16 = (table->InnerClipRect).Max.y;
  pfVar1 = &(table->HostClipRect).Min.y;
  if (fVar16 < *pfVar1 || fVar16 == *pfVar1) {
    return;
  }
  fVar16 = (table->HostClipRect).Max.x;
  if (fVar16 < (table->InnerClipRect).Min.x || fVar16 == (table->InnerClipRect).Min.x) {
    return;
  }
  fVar16 = (table->InnerClipRect).Max.x;
  if (fVar16 < (table->HostClipRect).Min.x || fVar16 == (table->HostClipRect).Min.x) {
    return;
  }
  fVar16 = (table->OuterRect).Min.y;
  fVar15 = fVar16;
  if (table->IsUsingHeaders == true) {
    if (table->FreezeRowsCount < '\x01') {
      fVar15 = (table->WorkRect).Min.y;
    }
    fVar15 = fVar15 + table->LastFirstRowHeight;
  }
  this_00 = pIVar6->DrawList;
  this = pIVar5->DrawList;
  uVar10 = table->Flags;
  if (((uVar10 >> 10 & 1) != 0) && (0 < table->ColumnsCount)) {
    fVar3 = (table->OuterRect).Max.y;
    uVar12 = 0;
    local_5c = fVar16;
    local_44 = fVar15;
    local_40 = this_00;
    local_38 = this;
    do {
      if ((table->VisibleMaskByDisplayOrder >> (uVar12 & 0x3f) & 1) != 0) {
        pcVar11 = (table->DisplayOrderToIndex).Data + uVar12;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar11) {
          pcVar11 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
LAB_002c0ccf:
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_internal.h"
                        ,0x217,pcVar11);
        }
        cVar4 = *pcVar11;
        if (((long)cVar4 < 0) ||
           (pIVar13 = (table->Columns).Data + cVar4, (table->Columns).DataEnd <= pIVar13)) {
          pcVar11 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
          goto LAB_002c0ccf;
        }
        if (table->ResizedColumn == cVar4) {
          bVar14 = table->InstanceInteracted == table->InstanceCurrent;
        }
        else {
          bVar14 = false;
        }
        fVar15 = pIVar13->MaxX;
        pIVar2 = &(table->InnerClipRect).Max;
        if ((!(bool)((fVar15 < pIVar2->x || fVar15 == pIVar2->x) | bVar14)) ||
           (((pIVar13->NextVisibleColumn == -1 && ((pIVar13->Flags & 0x40000020U) != 0)) ||
            (fVar15 <= (pIVar13->ClipRect).Min.x)))) goto LAB_002c0acc;
        fVar15 = fVar3;
        if ((table->HoveredColumnBorder == cVar4 || bVar14) ||
           ((table->FreezeColumnsCount != -1 &&
            (uVar12 + 1 == (ulong)(uint)(int)table->FreezeColumnsCount)))) {
          if (bVar14) {
            idx = 0x1d;
          }
          else {
            if (table->HoveredColumnBorder != cVar4) {
              IVar9 = table->BorderColorStrong;
              goto LAB_002c0a85;
            }
            idx = 0x1c;
          }
          IVar9 = GetColorU32(idx,1.0);
          fVar16 = local_5c;
        }
        else {
          bVar14 = (table->Flags & 0x3000) == 0;
          if (!bVar14) {
            fVar15 = local_44;
          }
          IVar9 = table->RowBgColor[(ulong)bVar14 + 2];
        }
LAB_002c0a85:
        if (fVar16 < fVar15) {
          local_58.x = pIVar13->MaxX;
          local_68.y = fVar15;
          local_68.x = local_58.x;
          local_58.y = fVar16;
          ImDrawList::AddLine(local_40,&local_58,&local_68,IVar9,1.0);
          fVar16 = local_5c;
        }
      }
LAB_002c0acc:
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)table->ColumnsCount);
    uVar10 = table->Flags;
    this = local_38;
    this_00 = local_40;
  }
  if ((uVar10 & 0xa00) == 0) goto LAB_002c0c24;
  IVar7 = (table->OuterRect).Min;
  IVar8 = (table->OuterRect).Max;
  local_58.x = IVar7.x;
  local_58.y = IVar7.y;
  IStack_50.x = IVar8.x;
  IStack_50.y = IVar8.y;
  if (pIVar6 != pIVar5) {
    local_58.x = local_58.x + -1.0;
    local_58.y = local_58.y + -1.0;
    IStack_50.x = IStack_50.x + 1.0;
    IStack_50.y = IStack_50.y + 1.0;
  }
  IVar9 = table->BorderColorStrong;
  if ((uVar10 & 0xa00) == 0xa00) {
    ImDrawList::AddRect(this,&local_58,&IStack_50,IVar9,0.0,-1,1.0);
  }
  else {
    if ((uVar10 >> 0xb & 1) == 0) {
      if ((uVar10 >> 9 & 1) == 0) goto LAB_002c0c21;
      local_68.y = local_58.y;
      local_68.x = IStack_50.x;
      ImDrawList::AddLine(this,&local_58,&local_68,IVar9,1.0);
      local_68.y = IStack_50.y;
      local_68.x = local_58.x;
    }
    else {
      local_68.y = IStack_50.y;
      local_68.x = local_58.x;
      ImDrawList::AddLine(this,&local_58,&local_68,IVar9,1.0);
      local_68.y = local_58.y;
      local_68.x = IStack_50.x;
    }
    ImDrawList::AddLine(this,&local_68,&IStack_50,IVar9,1.0);
  }
LAB_002c0c21:
  uVar10 = table->Flags;
LAB_002c0c24:
  if ((((uVar10 >> 8 & 1) != 0) &&
      (local_58.y = table->RowPosY2, local_58.y < (table->OuterRect).Max.y)) &&
     (((table->BgClipRect).Min.y <= local_58.y && (local_58.y < (table->BgClipRect).Max.y)))) {
    local_58.x = table->BorderX1;
    local_68.y = local_58.y;
    local_68.x = table->BorderX2;
    ImDrawList::AddLine(this_00,&local_58,&local_68,table->BorderColorLight,1.0);
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_BG0);
    if (inner_window->Hidden || !table->HostClipRect.Overlaps(table->InnerClipRect))
        return;
    ImDrawList* inner_drawlist = inner_window->DrawList;
    ImDrawList* outer_drawlist = outer_window->DrawList;

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->OuterRect.Min.y;
    const float draw_y2_body = table->OuterRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ((table->FreezeRowsCount >= 1 ? table->OuterRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;

    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;

            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)// && is_hovered)
                continue;
            if (column->NextVisibleColumn == -1 && !is_resizable)
                continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || (table->FreezeColumnsCount != -1 && table->FreezeColumnsCount == order_n + 1))
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME-TABLE: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if (inner_window != outer_window) // FIXME-TABLE
            outer_border.Expand(1.0f);
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            outer_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, ~0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            outer_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            outer_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            outer_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            outer_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }
}